

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void * __thiscall CASC_ARRAY::InsertAt(CASC_ARRAY *this,size_t ItemIndex)

{
  size_t NewItemCount;
  void *pvVar1;
  size_t AddedItemCount;
  void *pNewItem;
  size_t ItemIndex_local;
  CASC_ARRAY *this_local;
  
  if (this->m_ItemCount < ItemIndex) {
    NewItemCount = ItemIndex - this->m_ItemCount;
    pvVar1 = Insert(this,(void *)0x0,NewItemCount);
    if (pvVar1 == (void *)0x0) {
      return (void *)0x0;
    }
    memset(pvVar1,0,this->m_ItemSize * NewItemCount);
  }
  if (ItemIndex == this->m_ItemCount) {
    Insert(this,(void *)0x0,1);
  }
  pvVar1 = ItemAt(this,ItemIndex);
  return pvVar1;
}

Assistant:

void * InsertAt(size_t ItemIndex)
    {
        void * pNewItem;
        size_t AddedItemCount;

        // Is there enough items?
        if (ItemIndex > m_ItemCount)
        {
            // Capture the new item count
            AddedItemCount = ItemIndex - m_ItemCount;

            // Insert the amount of items
            pNewItem = Insert(NULL, AddedItemCount);
            if (pNewItem == NULL)
                return NULL;

            // Zero the inserted items
            memset(pNewItem, 0, m_ItemSize * AddedItemCount);
        }

        // Is the item already inserted?
        if (ItemIndex == m_ItemCount)
        {
            Insert(NULL, 1);
        }

        // Return the item at a given index
        return ItemAt(ItemIndex);
    }